

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O2

void __thiscall
re2c::Warn::unreachable_rule(Warn *this,string *cond,rule_info_t *rule,rules_t *rules)

{
  size_t sVar1;
  FILE *pFVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  uint uVar5;
  bool error;
  char *pcVar6;
  string local_50;
  
  if ((this->mask[5] & 1) != 0) {
    uVar5 = this->mask[5] & 2;
    error = SUB41(uVar5 >> 1,0);
    this->error_accuml = (bool)(this->error_accuml | error);
    warning_start(rule->line,error);
    pFVar2 = _stderr;
    incond(&local_50,cond);
    fprintf(pFVar2,"unreachable rule %s",local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar2 = _stderr;
    sVar1 = (rule->shadow)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar1 != 0) {
      pcVar6 = "s";
      if (sVar1 == 1) {
        pcVar6 = "";
      }
      p_Var4 = (rule->shadow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cVar3 = std::
              _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
              ::find(&rules->_M_t,(key_type *)(p_Var4 + 1));
      fprintf(pFVar2,"(shadowed by rule%s at line%s %u",pcVar6,pcVar6,
              (ulong)*(uint *)&cVar3._M_node[1]._M_parent);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      for (; pFVar2 = _stderr,
          (_Rb_tree_header *)p_Var4 != &(rule->shadow)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        cVar3 = std::
                _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                ::find(&rules->_M_t,(key_type *)(p_Var4 + 1));
        fprintf(pFVar2,", %u",(ulong)*(uint *)&cVar3._M_node[1]._M_parent);
      }
      fputc(0x29,_stderr);
    }
    warning_end(PTR_anon_var_dwarf_49580_001662f8,uVar5 != 0);
  }
  return;
}

Assistant:

void Warn::unreachable_rule (const std::string & cond, const rule_info_t & rule, const rules_t & rules)
{
	if (mask[UNREACHABLE_RULES] & WARNING)
	{
		const bool e = mask[UNREACHABLE_RULES] & ERROR;
		error_accuml |= e;
		warning_start (rule.line, e);
		fprintf (stderr, "unreachable rule %s", incond (cond).c_str ());
		const size_t shadows = rule.shadow.size ();
		if (shadows > 0)
		{
			const char * pl = shadows > 1
				? "s"
				: "";
			std::set<rule_rank_t>::const_iterator i = rule.shadow.begin ();
			fprintf (stderr, "(shadowed by rule%s at line%s %u", pl, pl, rules.find (*i)->second.line);
			for (++i; i != rule.shadow.end (); ++i)
			{
				fprintf (stderr, ", %u", rules.find (*i)->second.line);
			}
			fprintf (stderr, ")");
		}
		warning_end (names[UNREACHABLE_RULES], e);
	}
}